

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

uint64_t ptls_decode_quicint(uint8_t **src,uint8_t *end)

{
  byte bVar1;
  uint64_t uVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  
  pbVar3 = *src;
  uVar2 = 0xffffffffffffffff;
  if (pbVar3 != end) {
    *src = pbVar3 + 1;
    bVar1 = *pbVar3;
    if ((ulong)bVar1 < 0x40) {
      return (ulong)bVar1;
    }
    uVar4 = -1 << (bVar1 >> 6);
    if ((ulong)~uVar4 <= (ulong)((long)end - (long)(pbVar3 + 1))) {
      uVar2 = (uint64_t)(bVar1 & 0x3f);
      pbVar3 = pbVar3 + 2;
      iVar5 = uVar4 + 1;
      do {
        *src = pbVar3;
        uVar2 = uVar2 << 8 | (ulong)pbVar3[-1];
        pbVar3 = pbVar3 + 1;
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0);
    }
  }
  return uVar2;
}

Assistant:

uint64_t ptls_decode_quicint(const uint8_t **src, const uint8_t *end)
{
    if (PTLS_UNLIKELY(*src == end))
        return UINT64_MAX;

    uint8_t b = *(*src)++;

    if (PTLS_LIKELY(b <= 0x3f))
        return b;

    uint64_t v = b & 0x3f;
    unsigned bytes_left = (1 << (b >> 6)) - 1;
    if (PTLS_UNLIKELY((size_t)(end - *src) < bytes_left))
        return UINT64_MAX;
    do {
        v = (v << 8) | *(*src)++;
    } while (--bytes_left != 0);
    return v;
}